

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdTruthPartialTwo
               (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp,int iVar,uint *pTruthCo,
               uint *pTruthDec)

{
  undefined2 uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  
  puVar2 = Kit_DsdTruthComputeTwo(p,pNtk,uSupp,iVar,pTruthDec);
  if (pTruthCo != (uint *)0x0) {
    uVar1 = pNtk->nVars;
    uVar4 = 1 << ((char)uVar1 - 5U & 0x1f);
    if ((ushort)uVar1 < 6) {
      uVar4 = 1;
    }
    if (0 < (int)uVar4) {
      uVar3 = (ulong)uVar4 + 1;
      do {
        pTruthCo[uVar3 - 2] = puVar2[uVar3 - 2];
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

void Kit_DsdTruthPartialTwo( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp, int iVar, unsigned * pTruthCo, unsigned * pTruthDec )
{
    unsigned * pTruth = Kit_DsdTruthComputeTwo( p, pNtk, uSupp, iVar, pTruthDec );
    if ( pTruthCo )
        Kit_TruthCopy( pTruthCo, pTruth, pNtk->nVars );
}